

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionValue *
CreateGenericFunctionInstance
          (FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
          FunctionValue proto,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
          bool standalone)

{
  int iVar1;
  int iVar2;
  FunctionData *pFVar3;
  ScopeData *target;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  IntrusiveList<MatchData> matches;
  ArrayView<ArgumentData> AVar7;
  Allocator *function_00;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  TypeRef *pTVar12;
  MatchData *pMVar13;
  FunctionData **ppFVar14;
  SynBase *pSVar15;
  size_t sVar16;
  char *pcVar17;
  ArgumentData *pAVar18;
  ExprBase *context_00;
  char *pcVar19;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  byte local_3ba;
  ExprBase *local_380;
  ExprBase *context;
  ExprGenericFunctionPrototype *local_370;
  ExprGenericFunctionPrototype *genericProto;
  ExprFunctionDefinition *definition;
  char *messageEnd;
  MatchData *curr_1;
  _func_int *p_Stack_348;
  uint i_1;
  TypeHandle *curr;
  char *messageStart;
  char *errorCurr;
  SynShortFunctionDefinition *node;
  MatchData *pMStack_320;
  SynFunctionDefinition *local_318;
  SynFunctionDefinition *syntax;
  ExprBase *pEStack_308;
  uint traceDepth;
  ExprBase *expr;
  undefined1 local_2f8 [7];
  bool prevErrorHandlerNested;
  jmp_buf prevErrorHandler;
  ScopeData *scope;
  TraceScope traceScope;
  ExprBase *context_1;
  FunctionData *data;
  undefined1 auStack_1d0 [4];
  uint i;
  undefined4 local_1c8;
  TypeFunction *local_1c0;
  TypeFunction *instance;
  TypeHandle *local_1b0;
  TypeHandle *currGeneric;
  MatchData *currMatch;
  IntrusiveList<MatchData> aliases;
  TypeBase *parentType;
  undefined1 local_160 [12];
  undefined1 local_150 [8];
  SmallArray<CallArgumentData,_16U> result;
  FunctionData *function;
  bool standalone_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> generics_local;
  
  result.allocator = (Allocator *)proto.function;
  SmallArray<CallArgumentData,_16U>::SmallArray
            ((SmallArray<CallArgumentData,_16U> *)local_150,ctx->allocator);
  ArrayView<ArgumentData>::ArrayView<4u>
            ((ArrayView<ArgumentData> *)local_160,
             (SmallArray<ArgumentData,_4U> *)(result.allocator + 0xe));
  AVar7 = arguments;
  functionArguments._12_4_ = 0;
  functionArguments.data = (ArgumentData *)local_160._0_8_;
  functionArguments.count = local_160._8_4_;
  arguments_00._12_4_ = 0;
  arguments_00.data = arguments.data;
  arguments_00.count = arguments.count;
  arguments = AVar7;
  bVar8 = PrepareArgumentsForFunctionCall
                    (ctx,source,functionArguments,arguments_00,
                     (SmallArray<CallArgumentData,_16U> *)local_150,(uint *)0x0,false);
  if (!bVar8) {
    __assert_fail("!\"unexpected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ab6,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  aliases.tail = (MatchData *)0x0;
  if ((TypeStruct *)(proto.context)->type == ctx->typeAutoRef) {
    local_3ba = 0;
    if (result.allocator[3]._vptr_Allocator[4] != (_func_int *)0x0) {
      local_3ba = (byte)result.allocator[3]._vptr_Allocator[4][0x3c] ^ 0xff;
    }
    if ((local_3ba & 1) == 0) {
      __assert_fail("function->scope->ownerType && !function->scope->ownerType->isGeneric",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1abc,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    aliases.tail = (MatchData *)result.allocator[3]._vptr_Allocator[4];
  }
  else if (result.allocator[3]._vptr_Allocator[4] != (_func_int *)0x0) {
    pTVar12 = getType<TypeRef>((proto.context)->type);
    aliases.tail = (MatchData *)pTVar12->subType;
  }
  if ((aliases.tail != (MatchData *)0x0) && ((aliases.tail[1].field_0x1c & 1) != 0)) {
    anon_unknown.dwarf_e7629::Stop
              (ctx,source,"ERROR: generic type arguments required for type \'%.*s\'",
               (ulong)(uint)(*(int *)&(aliases.tail)->listed - (int)(aliases.tail)->next));
  }
  IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&currMatch);
  local_1b0 = generics.head;
  for (currGeneric = (TypeHandle *)result.allocator[9]._vptr_Allocator;
      function_00 = result.allocator, pMVar13 = aliases.tail,
      currGeneric != (TypeHandle *)0x0 && local_1b0 != (TypeHandle *)0x0;
      currGeneric = *(TypeHandle **)&currGeneric->listed) {
    bVar8 = isType<TypeError>(local_1b0->type);
    if (bVar8) {
      FunctionValue::FunctionValue(__return_storage_ptr__);
      instance._4_4_ = 1;
      goto LAB_0022ca2a;
    }
    pMVar13 = ExpressionContext::get<MatchData>(ctx);
    MatchData::MatchData(pMVar13,(SynIdentifier *)currGeneric->type,local_1b0->type);
    IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&currMatch,pMVar13);
    local_1b0 = local_1b0->next;
  }
  ArrayView<CallArgumentData>::ArrayView<16u>
            ((ArrayView<CallArgumentData> *)auStack_1d0,
             (SmallArray<CallArgumentData,_16U> *)local_150);
  arguments_01._12_4_ = 0;
  arguments_01.data = (CallArgumentData *)_auStack_1d0;
  arguments_01.count = local_1c8;
  local_1c0 = GetGenericFunctionInstanceType
                        (ctx,source,(TypeBase *)pMVar13,(FunctionData *)function_00,arguments_01,
                         (IntrusiveList<MatchData> *)&currMatch);
  if (local_1c0 == (TypeFunction *)0x0) {
    anon_unknown.dwarf_e7629::Report
              (ctx,source,"ERROR: failed to instantiate generic function \'%.*s\'",
               (ulong)(uint)(*(int *)(result.allocator[7]._vptr_Allocator + 9) -
                            (int)result.allocator[7]._vptr_Allocator[8]));
    FunctionValue::FunctionValue(__return_storage_ptr__);
    instance._4_4_ = 1;
  }
  else {
    if ((((local_1c0->super_TypeBase).isGeneric ^ 0xffU) & 1) == 0) {
      __assert_fail("!instance->isGeneric",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1adf,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    for (data._4_4_ = 0;
        uVar9 = SmallArray<FunctionData_*,_8U>::size
                          ((SmallArray<FunctionData_*,_8U> *)(result.allocator + 0x2d)),
        data._4_4_ < uVar9; data._4_4_ = data._4_4_ + 1) {
      ppFVar14 = SmallArray<FunctionData_*,_8U>::operator[]
                           ((SmallArray<FunctionData_*,_8U> *)(result.allocator + 0x2d),data._4_4_);
      pFVar3 = *ppFVar14;
      if ((((TypeBase *)aliases.tail == pFVar3->scope->ownerType) &&
          (bVar8 = anon_unknown.dwarf_e7629::SameGenerics(pFVar3->generics,generics), bVar8)) &&
         (bVar8 = anon_unknown.dwarf_e7629::SameArguments(pFVar3->type,local_1c0), bVar8)) {
        traceScope._8_8_ = proto.context;
        if (pFVar3->scope->ownerType == (TypeBase *)0x0) {
          bVar8 = isType<ExprNullptrLiteral>(proto.context);
          if (!bVar8) {
            __assert_fail("isType<ExprNullptrLiteral>(context)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1af3,
                          "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          pSVar15 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
          traceScope._8_8_ = CreateFunctionContextAccess(ctx,pSVar15,pFVar3);
        }
        ppFVar14 = SmallArray<FunctionData_*,_8U>::operator[]
                             ((SmallArray<FunctionData_*,_8U> *)(result.allocator + 0x2d),data._4_4_
                             );
        FunctionValue::FunctionValue
                  (__return_storage_ptr__,source,*ppFVar14,(ExprBase *)traceScope._8_8_);
        instance._4_4_ = 1;
        goto LAB_0022ca2a;
      }
    }
    if ((CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
         ::token == '\0') &&
       (iVar10 = __cxa_guard_acquire(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                                      ::token), iVar10 != 0)) {
      CreateGenericFunctionInstance::token =
           NULLC::TraceGetToken("analyze","CreateGenericFunctionInstance");
      __cxa_guard_release(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                           ::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)&scope,CreateGenericFunctionInstance::token);
    if (((proto.function)->name != (SynIdentifier *)0x0) &&
       (((proto.function)->name->super_SynBase).begin != (Lexeme *)0x0)) {
      NULLC::TraceLabel((((proto.function)->name->super_SynBase).begin)->pos,
                        (((proto.function)->name->super_SynBase).end)->pos);
    }
    target = ctx->scope;
    ExpressionContext::SwitchToScopeAtPoint
              (ctx,(ScopeData *)result.allocator[3]._vptr_Allocator,
               (SynBase *)(result.allocator)->_vptr_Allocator);
    ctx->functionInstanceDepth = ctx->functionInstanceDepth + 1;
    if (0x40 < ctx->functionInstanceDepth) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,source,"ERROR: reached maximum generic function instance depth (%d)",0x40);
    }
    memcpy(local_2f8,ctx->errorHandler,200);
    expr._7_1_ = ctx->errorHandlerNested & 1;
    ctx->errorHandlerNested = true;
    pEStack_308 = (ExprBase *)0x0;
    syntax._4_4_ = NULLC::TraceGetDepth();
    iVar10 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
    if (iVar10 == 0) {
      local_318 = GetGenericFunctionDefinition(ctx,source,(FunctionData *)result.allocator);
      if (local_318 == (SynFunctionDefinition *)0x0) {
        errorCurr = (char *)getType<SynShortFunctionDefinition>
                                      ((SynBase *)result.allocator[0x3a]._vptr_Allocator[2]);
        if ((SynShortFunctionDefinition *)errorCurr == (SynShortFunctionDefinition *)0x0) {
          anon_unknown.dwarf_e7629::Stop
                    (ctx,source,"ERROR: imported generic function call is not supported");
        }
        else {
          pEStack_308 = AnalyzeShortFunctionDefinition
                                  (ctx,(SynShortFunctionDefinition *)errorCurr,
                                   (FunctionData *)result.allocator,local_1c0);
        }
      }
      else {
        node = (SynShortFunctionDefinition *)currMatch;
        pMStack_320 = aliases.head;
        matches.tail = aliases.head;
        matches.head = currMatch;
        pEStack_308 = AnalyzeFunctionDefinition
                                (ctx,local_318,(FunctionData *)result.allocator,local_1c0,
                                 (TypeBase *)aliases.tail,matches,false,false,false);
      }
      ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
      ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
      memcpy(ctx->errorHandler,local_2f8,200);
      ctx->errorHandlerNested = (bool)(expr._7_1_ & 1);
      genericProto = (ExprGenericFunctionPrototype *)getType<ExprFunctionDefinition>(pEStack_308);
      if ((ExprFunctionDefinition *)genericProto == (ExprFunctionDefinition *)0x0) {
        __assert_fail("definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b66,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      if (((ExprFunctionDefinition *)genericProto)->contextVariableDefinition !=
          (ExprVariableDefinition *)0x0) {
        local_370 = getType<ExprGenericFunctionPrototype>
                              ((ExprBase *)result.allocator[0x3a]._vptr_Allocator);
        if (local_370 == (ExprGenericFunctionPrototype *)0x0) {
          context = genericProto[1].super_ExprBase.next;
          SmallArray<ExprBase_*,_128U>::push_back(&ctx->setup,&context);
        }
        else {
          IntrusiveList<ExprVariableDefinition>::push_back
                    (&local_370->contextVariables,
                     (ExprVariableDefinition *)genericProto[1].super_ExprBase.next);
        }
      }
      if (standalone) {
        FunctionValue::FunctionValue(__return_storage_ptr__);
      }
      else {
        local_380 = proto.context;
        if (genericProto->function->scope->ownerType == (TypeBase *)0x0) {
          bVar8 = isType<ExprNullptrLiteral>(proto.context);
          if (!bVar8) {
            __assert_fail("isType<ExprNullptrLiteral>(context)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1b77,
                          "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          pSVar15 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
          local_380 = CreateFunctionContextAccess(ctx,pSVar15,genericProto->function);
        }
        pFVar3 = genericProto->function;
        context_00 = CreateSequence(ctx,source,&genericProto->super_ExprBase,local_380);
        FunctionValue::FunctionValue(__return_storage_ptr__,source,pFVar3,context_00);
      }
    }
    else {
      NULLC::TraceLeaveTo(syntax._4_4_);
      ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
      ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
      if (ctx->errorBuf != (char *)0x0) {
        pcVar19 = ctx->errorBuf;
        sVar16 = strlen(pcVar19);
        curr = (TypeHandle *)(pcVar19 + sVar16);
        messageStart = (char *)curr;
        iVar10 = NULLC::SafeSprintf((char *)curr,
                                    (ulong)(ctx->errorBufSize + (*(int *)&ctx->errorBuf - (int)curr)
                                           ),"while instantiating generic function %.*s(",
                                    (ulong)(uint)(*(int *)(result.allocator[7]._vptr_Allocator + 9)
                                                 - (int)result.allocator[7]._vptr_Allocator[8]));
        messageStart = messageStart + iVar10;
        for (p_Stack_348 = result.allocator[5]._vptr_Allocator[0xd]; p_Stack_348 != (_func_int *)0x0
            ; p_Stack_348 = *(_func_int **)(p_Stack_348 + 8)) {
          pcVar19 = "";
          if (p_Stack_348 != result.allocator[5]._vptr_Allocator[0xd]) {
            pcVar19 = ", ";
          }
          iVar10 = NULLC::SafeSprintf(messageStart,
                                      (ulong)(ctx->errorBufSize +
                                             (*(int *)&ctx->errorBuf - (int)messageStart)),"%s%.*s",
                                      pcVar19,(ulong)(uint)(*(int *)(*(long *)p_Stack_348 + 0x18) -
                                                           (int)*(undefined8 *)
                                                                 (*(long *)p_Stack_348 + 0x10)));
          messageStart = messageStart + iVar10;
        }
        iVar10 = NULLC::SafeSprintf(messageStart,
                                    (ulong)(ctx->errorBufSize +
                                           (*(int *)&ctx->errorBuf - (int)messageStart)),")");
        messageStart = messageStart + iVar10;
        bVar8 = ArrayView<ArgumentData>::empty(&arguments);
        if (!bVar8) {
          iVar10 = NULLC::SafeSprintf(messageStart,
                                      (ulong)(ctx->errorBufSize +
                                             (*(int *)&ctx->errorBuf - (int)messageStart)),
                                      "\n  using argument(s) (");
          messageStart = messageStart + iVar10;
          curr_1._4_4_ = 0;
          while( true ) {
            uVar9 = curr_1._4_4_;
            uVar11 = ArrayView<ArgumentData>::size(&arguments);
            pcVar19 = messageStart;
            iVar10 = (int)messageStart;
            if (uVar11 <= uVar9) break;
            iVar1 = *(int *)&ctx->errorBuf;
            uVar9 = ctx->errorBufSize;
            pcVar17 = "";
            if (curr_1._4_4_ != 0) {
              pcVar17 = ", ";
            }
            pAVar18 = ArrayView<ArgumentData>::operator[](&arguments,curr_1._4_4_);
            pcVar4 = (pAVar18->type->name).end;
            pAVar18 = ArrayView<ArgumentData>::operator[](&arguments,curr_1._4_4_);
            iVar2 = *(int *)&(pAVar18->type->name).begin;
            pAVar18 = ArrayView<ArgumentData>::operator[](&arguments,curr_1._4_4_);
            iVar10 = NULLC::SafeSprintf(pcVar19,(ulong)(uVar9 + (iVar1 - iVar10)),"%s%.*s",pcVar17,
                                        (ulong)(uint)((int)pcVar4 - iVar2),
                                        (pAVar18->type->name).begin);
            messageStart = messageStart + iVar10;
            curr_1._4_4_ = curr_1._4_4_ + 1;
          }
          iVar10 = NULLC::SafeSprintf(messageStart,
                                      (ulong)(ctx->errorBufSize + (*(int *)&ctx->errorBuf - iVar10))
                                      ,")");
          messageStart = messageStart + iVar10;
        }
        bVar8 = IntrusiveList<MatchData>::empty((IntrusiveList<MatchData> *)&currMatch);
        if (!bVar8) {
          iVar10 = NULLC::SafeSprintf(messageStart,
                                      (ulong)(ctx->errorBufSize +
                                             (*(int *)&ctx->errorBuf - (int)messageStart)),
                                      "\n  with [");
          messageStart = messageStart + iVar10;
          for (messageEnd = (char *)currMatch; messageEnd != (char *)0x0;
              messageEnd = *(char **)(messageEnd + 0x10)) {
            pcVar19 = "";
            if ((MatchData *)messageEnd != currMatch) {
              pcVar19 = ", ";
            }
            uVar5 = *(undefined8 *)(*(long *)messageEnd + 0x40);
            uVar6 = *(undefined8 *)(*(long *)(messageEnd + 8) + 0x10);
            iVar10 = NULLC::SafeSprintf(messageStart,
                                        (ulong)(ctx->errorBufSize +
                                               (*(int *)&ctx->errorBuf - (int)messageStart)),
                                        "%s%.*s = %.*s",pcVar19,
                                        (ulong)(uint)(*(int *)(*(long *)messageEnd + 0x48) -
                                                     (int)uVar5),uVar5,
                                        *(int *)(*(long *)(messageEnd + 8) + 0x18) - (int)uVar6,
                                        uVar6);
            messageStart = messageStart + iVar10;
          }
          iVar10 = NULLC::SafeSprintf(messageStart,
                                      (ulong)(ctx->errorBufSize +
                                             (*(int *)&ctx->errorBuf - (int)messageStart)),"]");
          messageStart = messageStart + iVar10;
        }
        definition = (ExprFunctionDefinition *)messageStart;
        anon_unknown.dwarf_e7629::AddRelatedErrorInfoWithLocation
                  (ctx,source,(char *)curr,messageStart);
      }
      memcpy(ctx->errorHandler,local_2f8,200);
      ctx->errorHandlerNested = (bool)(expr._7_1_ & 1);
      if ((ctx->errorHandlerNested & 1U) != 0) {
        if ((ctx->errorHandlerActive & 1U) != 0) {
          longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
        }
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b52,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      ctx->errorCount = ctx->errorCount + 1;
      FunctionValue::FunctionValue(__return_storage_ptr__);
    }
    instance._4_4_ = 1;
    NULLC::TraceScope::~TraceScope((TraceScope *)&scope);
  }
LAB_0022ca2a:
  SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_150);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue CreateGenericFunctionInstance(ExpressionContext &ctx, SynBase *source, FunctionValue proto, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool standalone)
{
	FunctionData *function = proto.function;

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false))
		assert(!"unexpected");

	TypeBase *parentType = NULL;

	if(proto.context->type == ctx.typeAutoRef)
	{
		assert(function->scope->ownerType && !function->scope->ownerType->isGeneric);
		parentType = function->scope->ownerType;
	}
	else if(function->scope->ownerType)
	{
		parentType = getType<TypeRef>(proto.context->type)->subType;
	}

	if(parentType && parentType->isGeneric)
		Stop(ctx, source, "ERROR: generic type arguments required for type '%.*s'", FMT_ISTR(parentType->name));

	IntrusiveList<MatchData> aliases;

	{
		MatchData *currMatch = function->generics.head;
		TypeHandle *currGeneric = generics.head;

		for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
		{
			if(isType<TypeError>(currGeneric->type))
				return FunctionValue();

			aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
		}
	}

	TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

	if(!instance)
	{
		Report(ctx, source, "ERROR: failed to instantiate generic function '%.*s'", FMT_ISTR(function->name->name));

		return FunctionValue();
	}

	assert(!instance->isGeneric);

	// Search for an existing function
	for(unsigned i = 0; i < function->instances.size(); i++)
	{
		FunctionData *data = function->instances[i];

		if(parentType != data->scope->ownerType)
			continue;

		if(!SameGenerics(data->generics, generics))
			continue;

		if(!SameArguments(data->type, instance))
			continue;

		ExprBase *context = proto.context;

		if(!data->scope->ownerType)
		{
			assert(isType<ExprNullptrLiteral>(context));

			context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), data);
		}

		return FunctionValue(source, function->instances[i], context);
	}

	TRACE_SCOPE("analyze", "CreateGenericFunctionInstance");

	if(proto.function->name && proto.function->name->begin)
		TRACE_LABEL2(proto.function->name->begin->pos, proto.function->name->end->pos);

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	ctx.functionInstanceDepth++;

	if(ctx.functionInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic function instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ExprBase *expr = NULL;
	
	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
			expr = AnalyzeFunctionDefinition(ctx, syntax, function, instance, parentType, aliases, false, false, false);
		else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(function->declaration->source))
			expr = AnalyzeShortFunctionDefinition(ctx, node, function, instance);
		else
			Stop(ctx, source, "ERROR: imported generic function call is not supported");
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.functionInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic function %.*s(", FMT_ISTR(function->name->name));

			for(TypeHandle *curr = function->type->arguments.head; curr; curr = curr->next)
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != function->type->arguments.head ? ", " : "", FMT_ISTR(curr->type->name));

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");

			if(!arguments.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  using argument(s) (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");
			}

			if(!aliases.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  with [");

				for(MatchData *curr = aliases.head; curr; curr = curr->next)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "]");
			}

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		return FunctionValue();
	}

	ctx.functionInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(expr);

	assert(definition);

	if(definition->contextVariableDefinition)
	{
		if(ExprGenericFunctionPrototype *genericProto = getType<ExprGenericFunctionPrototype>(function->declaration))
			genericProto->contextVariables.push_back(definition->contextVariableDefinition);
		else
			ctx.setup.push_back(definition->contextVariableDefinition);
	}

	if(standalone)
		return FunctionValue();

	ExprBase *context = proto.context;

	if(!definition->function->scope->ownerType)
	{
		assert(isType<ExprNullptrLiteral>(context));

		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function);
	}

	return FunctionValue(source, definition->function, CreateSequence(ctx, source, definition, context));
}